

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

int tjCompressFromYUV(tjhandle handle,uchar *srcBuf,int width,int pad,int height,int subsamp,
                     uchar **jpegBuf,unsigned_long *jpegSize,int jpegQual,int flags)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  long *in_FS_OFFSET;
  int ph1;
  int pw1;
  tjinstance *this;
  int retval;
  int strides [3];
  int ph0;
  int pw0;
  uchar *srcPlanes [3];
  int in_stack_00000198;
  int in_stack_0000019c;
  int *in_stack_000001a0;
  int in_stack_000001ac;
  uchar **in_stack_000001b0;
  tjhandle in_stack_000001b8;
  uchar **in_stack_000001d0;
  unsigned_long *in_stack_000001d8;
  int in_stack_000001e0;
  int in_stack_000001e8;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  
  if (in_RDI == 0) {
    snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s","tjCompressFromYUV(): Invalid handle");
  }
  else {
    *(undefined4 *)(in_RDI + 0x6d0) = 0;
    if ((((in_RSI != 0) && (0 < in_EDX)) && (0 < in_ECX)) &&
       (((0 < in_R8D && (-1 < in_R9D)) && (in_R9D < 6)))) {
      tjPlaneWidth(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      tjPlaneHeight(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      if (in_R9D != 3) {
        tjPlaneWidth(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
        tjPlaneHeight(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c)
        ;
      }
      iVar1 = tjCompressFromYUVPlanes
                        (in_stack_000001b8,in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,
                         in_stack_0000019c,in_stack_00000198,in_stack_000001d0,in_stack_000001d8,
                         in_stack_000001e0,in_stack_000001e8);
      return iVar1;
    }
    snprintf((char *)(in_RDI + 0x608),200,"%s","tjCompressFromYUV(): Invalid argument");
    *(undefined4 *)(in_RDI + 0x6d0) = 1;
    snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s","tjCompressFromYUV(): Invalid argument");
  }
  return -1;
}

Assistant:

DLLEXPORT int tjCompressFromYUV(tjhandle handle, const unsigned char *srcBuf,
                                int width, int pad, int height, int subsamp,
                                unsigned char **jpegBuf,
                                unsigned long *jpegSize, int jpegQual,
                                int flags)
{
  const unsigned char *srcPlanes[3];
  int pw0, ph0, strides[3], retval = -1;
  tjinstance *this = (tjinstance *)handle;

  if (!this) THROWG("tjCompressFromYUV(): Invalid handle");
  this->isInstanceError = FALSE;

  if (srcBuf == NULL || width <= 0 || pad < 1 || height <= 0 || subsamp < 0 ||
      subsamp >= NUMSUBOPT)
    THROW("tjCompressFromYUV(): Invalid argument");

  pw0 = tjPlaneWidth(0, width, subsamp);
  ph0 = tjPlaneHeight(0, height, subsamp);
  srcPlanes[0] = srcBuf;
  strides[0] = PAD(pw0, pad);
  if (subsamp == TJSAMP_GRAY) {
    strides[1] = strides[2] = 0;
    srcPlanes[1] = srcPlanes[2] = NULL;
  } else {
    int pw1 = tjPlaneWidth(1, width, subsamp);
    int ph1 = tjPlaneHeight(1, height, subsamp);

    strides[1] = strides[2] = PAD(pw1, pad);
    srcPlanes[1] = srcPlanes[0] + strides[0] * ph0;
    srcPlanes[2] = srcPlanes[1] + strides[1] * ph1;
  }

  return tjCompressFromYUVPlanes(handle, srcPlanes, width, strides, height,
                                 subsamp, jpegBuf, jpegSize, jpegQual, flags);

bailout:
  return retval;
}